

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O3

void __thiscall Group::~Group(Group *this)

{
  pointer ppOVar1;
  pointer pcVar2;
  
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Group_0013fa08;
  ppOVar1 = (this->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar1 != (pointer)0x0) {
    operator_delete(ppOVar1);
  }
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013f990;
  pcVar2 = (this->super_Object3D).type._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_Object3D).type.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Group() {}